

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void __thiscall
testing::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,char *message)

{
  char *pcVar1;
  allocator local_41;
  string local_40;
  
  pcVar1 = "(null)";
  if (message != (char *)0x0) {
    pcVar1 = message;
  }
  std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
  PushTrace(this,file,line,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

ScopedTrace(const char* file, int line, const char* message) {
    PushTrace(file, line, message ? message : "(null)");
  }